

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

void __thiscall
FIX::DataDictionary::addXMLGroup
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool groupRequired)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pDVar5;
  ConfigError *this_00;
  pointer pDVar6;
  bool local_693;
  byte local_67a;
  byte local_642;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_5e0;
  allocator<char> local_5d1;
  string local_5d0 [38];
  bool local_5aa;
  allocator<char> local_5a9;
  string local_5a8 [6];
  bool isRequired;
  undefined1 local_588 [8];
  string required_1;
  DOMAttributesPtr attrs_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  allocator<char> local_519;
  string local_518 [32];
  undefined1 local_4f8 [8];
  string required;
  DOMAttributesPtr attrs_1;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_4b0;
  DOMNodePtr node;
  DataDictionary groupDD;
  int field;
  int delim;
  int group;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  string name;
  DOMAttributesPtr attrs;
  bool groupRequired_local;
  DataDictionary *DD_local;
  string *msgtype_local;
  DOMNode *pNode_local;
  DOMDocument *pDoc_local;
  DataDictionary *this_local;
  
  (*pNode->_vptr_DOMNode[4])();
  std::__cxx11::string::string((string *)local_60);
  pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&name.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"name",&local_81);
  iVar3 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_80,local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
    delim._2_1_ = 1;
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&group,"No name given to group",(allocator<char> *)((long)&delim + 3));
    ConfigError::ConfigError(this_00,(string *)&group);
    delim._2_1_ = 0;
    __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  iVar3 = lookupXMLFieldNumber(this,pDoc,(string *)local_60);
  groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  DataDictionary((DataDictionary *)&node);
  (*pNode->_vptr_DOMNode[2])(&local_4b0);
  do {
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_4b0);
    if (pDVar6 == (pointer)0x0) {
      if (groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0
         ) {
        addGroup(DD,msgtype,iVar3,
                 groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count.
                 _4_4_,(DataDictionary *)&node);
      }
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_4b0);
      ~DataDictionary((DataDictionary *)&node);
      std::__cxx11::string::~string((string *)local_60);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&name.field_2 + 8));
      return;
    }
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_4b0);
    (*pDVar6->_vptr_DOMNode[5])(&attrs_1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attrs_1,"field");
    std::__cxx11::string::~string((string *)&attrs_1);
    if (bVar2) {
      pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_4b0);
      groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           lookupXMLFieldNumber(this,pDoc,pDVar6);
      addField((DataDictionary *)&node,
               (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_4b0);
      (*pDVar6->_vptr_DOMNode[4])((undefined1 *)((long)&required.field_2 + 8));
      std::__cxx11::string::string((string *)local_4f8);
      pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&required.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_518,"required",&local_519);
      uVar4 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_518,local_4f8);
      local_642 = 0;
      bVar1 = local_642;
      if (((uVar4 & 1) != 0) &&
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_4f8,"Y"), bVar1 = groupRequired, !bVar2)) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4f8,"y");
        local_642 = 0;
        bVar1 = groupRequired;
        if (!bVar2) {
          bVar1 = local_642;
        }
      }
      local_642 = bVar1;
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator(&local_519);
      if ((local_642 & 1) != 0) {
        addRequiredField((DataDictionary *)&node,msgtype,
                         (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
      }
      std::__cxx11::string::~string((string *)local_4f8);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&required.field_2 + 8));
    }
    else {
      pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_4b0);
      (*pDVar6->_vptr_DOMNode[5])(&local_540);
      bVar2 = std::operator==(&local_540,"component");
      std::__cxx11::string::~string((string *)&local_540);
      if (bVar2) {
        pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_4b0);
        groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             addXMLComponentFields(this,pDoc,pDVar6,msgtype,(DataDictionary *)&node,false);
      }
      else {
        pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_4b0);
        (*pDVar6->_vptr_DOMNode[5])(&attrs_2);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attrs_2,"group");
        std::__cxx11::string::~string((string *)&attrs_2);
        if (bVar2) {
          pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                             (&local_4b0);
          groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               lookupXMLFieldNumber(this,pDoc,pDVar6);
          addField((DataDictionary *)&node,
                   (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
          pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                             (&local_4b0);
          (*pDVar6->_vptr_DOMNode[4])((undefined1 *)((long)&required_1.field_2 + 8));
          std::__cxx11::string::string((string *)local_588);
          pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                   operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                               *)((long)&required_1.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_5a8,"required",&local_5a9);
          uVar4 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_5a8,local_588);
          local_67a = 0;
          if ((uVar4 & 1) != 0) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_588,"Y");
            if (!bVar2) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_588,"y");
              local_67a = 0;
              if (!bVar2) goto LAB_0020cdcc;
            }
            local_67a = groupRequired;
          }
LAB_0020cdcc:
          std::__cxx11::string::~string(local_5a8);
          std::allocator<char>::~allocator(&local_5a9);
          if ((local_67a & 1) != 0) {
            addRequiredField((DataDictionary *)&node,msgtype,
                             (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
          }
          local_5aa = false;
          pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                   operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                               *)((long)&required_1.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_5d0,"required",&local_5d1);
          uVar4 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_5d0,local_588);
          std::__cxx11::string::~string(local_5d0);
          std::allocator<char>::~allocator(&local_5d1);
          if ((uVar4 & 1) != 0) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_588,"Y");
            local_693 = true;
            if (!bVar2) {
              local_693 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_588,"y");
            }
            local_5aa = local_693;
          }
          pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                             (&local_4b0);
          addXMLGroup(this,pDoc,pDVar6,msgtype,(DataDictionary *)&node,(bool)(local_5aa & 1));
          std::__cxx11::string::~string((string *)local_588);
          std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                    ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                     ((long)&required_1.field_2 + 8));
        }
      }
    }
    if (groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0)
    {
      groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_4b0);
    (*pDVar6->_vptr_DOMNode[3])(&local_5e0);
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release(&local_5e0);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_4b0,pDVar6);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_5e0);
  } while( true );
}

Assistant:

void DataDictionary::addXMLGroup(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool groupRequired) {
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to group");
  }
  int group = lookupXMLFieldNumber(pDoc, name);
  int delim = 0;
  int field = 0;
  DataDictionary groupDD;
  DOMNodePtr node = pNode->getFirstChildNode();
  while (node.get()) {
    if (node->getName() == "field") {
      field = lookupXMLFieldNumber(pDoc, node.get());
      groupDD.addField(field);

      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && groupRequired) {
        groupDD.addRequiredField(msgtype, field);
      }
    } else if (node->getName() == "component") {
      field = addXMLComponentFields(pDoc, node.get(), msgtype, groupDD, false);
    } else if (node->getName() == "group") {
      field = lookupXMLFieldNumber(pDoc, node.get());
      groupDD.addField(field);
      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && groupRequired) {
        groupDD.addRequiredField(msgtype, field);
      }
      bool isRequired = false;
      if (attrs->get("required", required)) {
        isRequired = (required == "Y" || required == "y");
      }
      addXMLGroup(pDoc, node.get(), msgtype, groupDD, isRequired);
    }
    if (delim == 0) {
      delim = field;
    }
    RESET_AUTO_PTR(node, node->getNextSiblingNode());
  }

  if (delim) {
    DD.addGroup(msgtype, group, delim, groupDD);
  }
}